

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

void __thiscall
CppGenerator::registerAggregatesToVariables
          (CppGenerator *this,Aggregate *aggregate,size_t group_id,size_t view_id,size_t agg_id,
          size_t depth,
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          *localAggReg)

{
  ulong *puVar1;
  ulong *puVar2;
  vector<PostAggRegTuple,std::allocator<PostAggRegTuple>> *this_00;
  uint uVar3;
  uint uVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar5;
  pointer pbVar6;
  pointer pbVar7;
  size_t *psVar8;
  pointer pbVar9;
  pointer pbVar10;
  _WordT _Var11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  pointer pDVar16;
  pointer ppVar17;
  pointer pvVar18;
  pointer pPVar19;
  undefined8 uVar20;
  pointer pvVar21;
  pointer pPVar22;
  iterator __position;
  pointer pDVar23;
  pointer pDVar24;
  uint uVar25;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *pvVar26;
  bool bVar27;
  View *pVVar28;
  size_t sVar29;
  Function *pFVar30;
  _WordT *p_Var31;
  pointer *pppVar32;
  iterator iVar33;
  mapped_type *pmVar34;
  unsigned_long uVar35;
  iterator iVar36;
  mapped_type *pmVar37;
  ostream *poVar38;
  int iVar39;
  long lVar40;
  long lVar41;
  unsigned_long *puVar42;
  _WordT _Var43;
  pair<unsigned_long,_unsigned_long> *__args;
  size_t var;
  ulong uVar44;
  ulong uVar45;
  size_t sVar46;
  iterator __position_00;
  bool bVar47;
  _Vector_impl_data *this_01;
  long lVar48;
  long lVar49;
  size_t *incViewID;
  pointer pbVar50;
  size_t *psVar51;
  size_type __n;
  ulong uVar52;
  bitset<1500UL> *this_02;
  long lVar53;
  mapped_type mVar54;
  ulong uVar55;
  long lVar56;
  mapped_type mVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  localComputation;
  dyn_bitset loopFactors;
  prod_bitset overlapFunc;
  prod_bitset localFunctions;
  prod_bitset considered;
  undefined1 local_718 [16];
  long local_6c8;
  ulong local_6c0;
  _Vector_impl_data local_6b8;
  long local_6a0;
  TDNode *local_698;
  long local_690;
  long local_688;
  unsigned_long local_680;
  ulong local_678;
  long local_670;
  long local_668;
  View *local_660;
  long local_658;
  undefined8 local_650;
  ulong local_648;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_640;
  undefined1 local_628 [16];
  size_t local_618;
  long local_610;
  long local_608;
  ulong local_600;
  ulong local_5f8;
  long local_5f0;
  Function *local_5e8;
  ulong local_5e0;
  undefined1 local_5d8 [16];
  undefined1 local_5c8 [192];
  undefined1 local_508 [24];
  ulong uStack_4f0;
  unsigned_long local_4e8;
  undefined1 uStack_4e0;
  undefined7 uStack_4df;
  unsigned_long uStack_4d8;
  bool bStack_4d0;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_4b0;
  bool local_498;
  undefined1 local_490 [192];
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_3d0;
  size_t local_3b8;
  unsigned_long uStack_3b0;
  unsigned_long local_3a8;
  unsigned_long uStack_3a0;
  bool local_398;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_390;
  allocator_type local_370 [8];
  ulong auStack_368 [23];
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_2b0;
  size_t local_298;
  unsigned_long uStack_290;
  unsigned_long local_288;
  unsigned_long uStack_280;
  undefined1 local_278;
  ulong local_270 [48];
  undefined1 local_f0 [192];
  
  local_680 = agg_id;
  pVVar28 = QueryCompiler::getView
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,view_id);
  local_698 = TreeDecomposition::getRelation
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (ulong)pVVar28->_origin);
  pbVar50 = (this->groupVariableOrderBitset).
            super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
            super__Vector_impl_data._M_start + group_id;
  pvVar5 = this->groupVariableOrder;
  pbVar6 = (aggregate->_agg).
           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  pbVar7 = (aggregate->_agg).
           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __n = ((long)pbVar7 - (long)pbVar6 >> 6) * -0x5555555555555555;
  uVar4 = pVVar28->_origin;
  uVar3 = pVVar28->_destination;
  sVar46 = local_698->_numOfNeighbors;
  local_660 = pVVar28;
  local_618 = group_id;
  sVar29 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_390,sVar29 + 1,0,(allocator<unsigned_long> *)local_5c8);
  local_5c8._8_8_ = 0;
  local_5c8._0_8_ =
       (long)pvVar5[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)pvVar5[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_640,__n,(value_type *)local_5c8,local_370);
  pvVar5 = pvVar5 + group_id;
  local_670 = sVar46 - (uVar4 != uVar3);
  local_718 = ZEXT816(0);
  local_6b8._M_start = (pair<unsigned_long,_unsigned_long> *)0x0;
  local_6b8._M_finish = (pair<unsigned_long,_unsigned_long> *)0x0;
  local_6b8._M_end_of_storage = (pair<unsigned_long,_unsigned_long> *)0x0;
  uVar44 = 0;
  memset(local_270,0,0xc0);
  memset(local_270 + 0x18,0,0xc0);
  auVar60._8_8_ = (pbVar50->super__Base_bitset<2UL>)._M_w[1] & 0xfffffffff;
  auVar60._0_8_ = (pbVar50->super__Base_bitset<2UL>)._M_w[0];
  local_628 = *(undefined1 (*) [16])(local_660->_fVars).super__Base_bitset<2UL>._M_w &
              (auVar60 ^ _DAT_002af670);
  local_5d8 = local_628;
  local_6a0 = view_id * 3;
  do {
    uVar52 = uVar44 >> 6;
    uVar55 = 1L << ((byte)uVar44 & 0x3f);
    if ((*(ulong *)(local_5d8 + uVar52 * 8) >> (uVar44 & 0x3f) & 1) != 0) {
      if (((local_698->_bag).super__Base_bitset<2UL>._M_w[uVar52] & uVar55) == 0) {
        psVar8 = (&(this->incomingViews->
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_finish)[local_6a0];
        for (psVar51 = (&(this->incomingViews->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start)[local_6a0]; psVar51 != psVar8;
            psVar51 = psVar51 + 1) {
          pVVar28 = QueryCompiler::getView
                              ((this->_qc).
                               super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               *psVar51);
          if (((pVVar28->_fVars).super__Base_bitset<2UL>._M_w[uVar52] & uVar55) != 0) {
            local_718 = local_718 |
                        *(undefined1 (*) [16])(pVVar28->_fVars).super__Base_bitset<2UL>._M_w &
                        (*(undefined1 (*) [16])(pbVar50->super__Base_bitset<2UL>)._M_w ^
                        _DAT_002af670);
          }
        }
      }
      else {
        local_718 = local_718 |
                    *(undefined1 (*) [16])(local_698->_bag).super__Base_bitset<2UL>._M_w &
                    (*(undefined1 (*) [16])(pbVar50->super__Base_bitset<2UL>)._M_w ^ _DAT_002af670);
      }
    }
    uVar44 = uVar44 + 1;
  } while (uVar44 != 100);
  if (pbVar7 == pbVar6) {
    if (((long)(pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3) - 1U != depth) goto LAB_0023f632;
  }
  else {
    local_678 = depth + 1;
    local_608 = __n + (__n == 0);
    local_5f8 = local_718._0_8_;
    local_600 = local_718._8_8_;
    local_610 = local_670 << 4;
    local_690 = 0;
    local_658 = depth << 4;
    local_628 = local_628 & local_718;
    lVar49 = 0;
    local_668 = 0;
    local_6c8 = 0;
    lVar41 = 0;
    do {
      pbVar9 = (aggregate->_agg).
               super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      this_02 = pbVar9 + lVar41;
      memset(local_270 + 0x18,0,0xc0);
      memset(local_270,0,0xc0);
      local_5f0 = (long)(pbVar9->super__Base_bitset<24UL>)._M_w + lVar49;
      sVar46 = 0;
      local_688 = lVar49;
      do {
        bVar27 = std::bitset<1500UL>::test(this_02,sVar46);
        if (bVar27) {
          uVar52 = sVar46 >> 6;
          uVar44 = local_270[uVar52 + 0x18];
          uVar55 = 1L << ((byte)sVar46 & 0x3f);
          if ((uVar44 >> (sVar46 & 0x3f) & 1) == 0) {
            pFVar30 = QueryCompiler::getFunction
                                ((this->_qc).
                                 super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,sVar46);
            local_270[uVar52 + 0x18] = uVar44 | uVar55;
            pbVar10 = (this->coveredVariables).
                      super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            bVar27 = true;
            lVar48 = 0;
            uVar44 = *(ulong *)((long)(pbVar10->super__Base_bitset<2UL>)._M_w + local_658) &
                     (pFVar30->_fVars).super__Base_bitset<2UL>._M_w[0];
            do {
              _Var43 = uVar44;
              _Var11 = (pFVar30->_fVars).super__Base_bitset<2UL>._M_w[lVar48];
              if (!bVar27) break;
              lVar48 = 1;
              bVar27 = false;
              uVar44 = *(ulong *)((long)(pbVar10->super__Base_bitset<2UL>)._M_w + local_658 + 8) &
                       (pFVar30->_fVars).super__Base_bitset<2UL>._M_w[1];
            } while (_Var43 == _Var11);
            if (_Var43 == _Var11) {
              p_Var31 = (((this->variableDependency).
                          super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super__Base_bitset<2UL>)._M_w
                        + 1;
              uVar44 = 0;
              local_718._0_8_ = 0;
              uVar45 = 0;
              do {
                if (((pFVar30->_fVars).super__Base_bitset<2UL>._M_w[uVar44 >> 6] >> (uVar44 & 0x3f)
                    & 1) != 0) {
                  local_718._0_8_ = local_718._0_8_ | ((_Base_bitset<2UL> *)(p_Var31 + -1))->_M_w[0]
                  ;
                  uVar45 = uVar45 | *p_Var31;
                }
                uVar44 = uVar44 + 1;
                p_Var31 = p_Var31 + 2;
              } while (uVar44 != 100);
              uVar44 = (pbVar50->super__Base_bitset<2UL>)._M_w[0];
              local_5e0 = uVar45 & 0xfffffffff & ~(pbVar50->super__Base_bitset<2UL>)._M_w[1];
              local_5e8 = pFVar30;
              memset(local_5c8,0,0xc0);
              *(ulong *)(local_5c8 + uVar52 * 8) = *(ulong *)(local_5c8 + uVar52 * 8) | uVar55;
              memcpy(local_370,local_5c8,0xc0);
              local_6c0 = 0;
              local_648 = 0;
              do {
                local_648 = local_648 | (local_5e8->_fVars).super__Base_bitset<2UL>._M_w[0];
                local_6c0 = local_6c0 | (local_5e8->_fVars).super__Base_bitset<2UL>._M_w[1];
                bVar27 = true;
                uVar52 = 0;
                local_650 = 0;
                do {
                  uVar55 = uVar52 >> 6;
                  uVar45 = 1L << ((byte)uVar52 & 0x3f);
                  if (((((this_02->super__Base_bitset<24UL>)._M_w[uVar55] >> (uVar52 & 0x3f) & 1) !=
                        0) && (uVar12 = local_270[uVar55 + 0x18], (uVar12 & uVar45) == 0)) &&
                     (uVar13 = auStack_368[uVar55 - 1], (uVar13 & uVar45) == 0)) {
                    pFVar30 = QueryCompiler::getFunction
                                        ((this->_qc).
                                         super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr,sVar46);
                    uVar14 = (pFVar30->_fVars).super__Base_bitset<2UL>._M_w[0];
                    uVar15 = (pFVar30->_fVars).super__Base_bitset<2UL>._M_w[1];
                    if ((uVar15 & local_5e0) != 0 || (uVar14 & local_718._0_8_ & ~uVar44) != 0) {
                      local_270[uVar55 + 0x18] = uVar12 | uVar45;
                      auStack_368[uVar55 - 1] = uVar13 | uVar45;
                      local_648 = local_648 | uVar14;
                      pbVar10 = (this->coveredVariables).
                                super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      bVar47 = true;
                      lVar49 = 0;
                      uVar55 = uVar14 & *(ulong *)((long)(pbVar10->super__Base_bitset<2UL>)._M_w +
                                                  local_658);
                      do {
                        _Var43 = uVar55;
                        _Var11 = (pFVar30->_fVars).super__Base_bitset<2UL>._M_w[lVar49];
                        if (!bVar47) break;
                        lVar49 = 1;
                        bVar47 = false;
                        uVar55 = *(ulong *)((long)(pbVar10->super__Base_bitset<2UL>)._M_w +
                                           local_658 + 8) & uVar15;
                      } while (_Var43 == _Var11);
                      local_6c0 = local_6c0 | uVar15;
                      bVar27 = (bool)(bVar27 & _Var43 == _Var11);
                      local_650 = CONCAT71((int7)((ulong)pFVar30 >> 8),1);
                    }
                  }
                  lVar48 = local_5f0;
                  lVar49 = local_688;
                  uVar52 = uVar52 + 1;
                } while (uVar52 != 0x5dc);
              } while ((~(byte)local_650 & 1) == 0 && !bVar27);
              if (bVar27) {
                if ((local_6c0 & local_600 &
                    ~(pbVar50->super__Base_bitset<2UL>)._M_w[1] & 0xfffffffff) == 0 &&
                    (local_648 & local_5f8 & ~(pbVar50->super__Base_bitset<2UL>)._M_w[0]) == 0) {
                  lVar40 = 0;
                  do {
                    local_270[lVar40] = local_270[lVar40] | auStack_368[lVar40 + -1];
                    local_270[lVar40 + 1] = local_270[lVar40 + 1] | auStack_368[lVar40];
                    lVar40 = lVar40 + 2;
                  } while (lVar40 != 0x18);
                }
                else {
                  if (this->viewLevelRegister[view_id] != depth) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"ERROR ERROR: in dependent computation:",0x26);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr," viewLevelRegister[viewID] != depth\n",0x24);
                  }
                  pDVar16 = (this->dependentComputation).
                            super__Vector_base<DependentComputation,_std::allocator<DependentComputation>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  lVar40 = 0;
                  do {
                    uVar44 = auStack_368[lVar40];
                    puVar1 = (ulong *)((long)(pDVar16->product).super__Base_bitset<24UL>._M_w +
                                      lVar40 * 8 + local_668);
                    uVar52 = puVar1[1];
                    puVar2 = (ulong *)((long)(pDVar16->product).super__Base_bitset<24UL>._M_w +
                                      lVar40 * 8 + local_668);
                    *puVar2 = *puVar1 | auStack_368[lVar40 + -1];
                    puVar2[1] = uVar52 | uVar44;
                    lVar40 = lVar40 + 2;
                  } while (lVar40 != 0x18);
                }
                memcpy(local_5c8,local_370,0xc0);
                lVar40 = 0;
                do {
                  lVar53 = lVar40 * 8;
                  uVar3 = *(uint *)(local_5c8 + lVar53 + 4);
                  uVar4 = *(uint *)(local_5c8 + lVar53 + 8);
                  uVar25 = *(uint *)(local_5c8 + lVar53 + 0xc);
                  lVar56 = lVar40 * 8;
                  *(uint *)(local_5c8 + lVar56) = *(uint *)(local_5c8 + lVar53) ^ 0xffffffff;
                  *(uint *)(local_5c8 + lVar56 + 4) = uVar3 ^ 0xffffffff;
                  *(uint *)(local_5c8 + lVar56 + 8) = uVar4 ^ 0xffffffff;
                  *(uint *)(local_5c8 + lVar56 + 0xc) = uVar25 ^ 0xffffffff;
                  lVar40 = lVar40 + 2;
                } while (lVar40 != 0x18);
                local_5c8._184_8_ = local_5c8._184_8_ & 0xfffffff;
                memcpy(local_f0,local_5c8,0xc0);
                lVar40 = 0;
                do {
                  *(undefined1 (*) [16])(lVar48 + lVar40 * 8) =
                       *(undefined1 (*) [16])(lVar48 + lVar40 * 8) &
                       *(undefined1 (*) [16])(local_f0 + lVar40 * 8);
                  lVar40 = lVar40 + 2;
                } while (lVar40 != 0x18);
              }
            }
          }
        }
        sVar46 = sVar46 + 1;
      } while (sVar46 != 0x5dc);
      if (local_6b8._M_finish != local_6b8._M_start) {
        local_6b8._M_finish = local_6b8._M_start;
      }
      if (local_670 != 0) {
        lVar48 = local_670 + local_6c8;
        lVar53 = local_690;
        lVar56 = local_670;
        lVar40 = local_6c8;
        do {
          local_6c8 = lVar40;
          ppVar17 = (aggregate->_incoming).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar40 = *(long *)((long)&ppVar17->first + lVar53);
          sVar46 = QueryCompiler::numberOfViews
                             ((this->_qc).
                              super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          lVar49 = local_688;
          uVar44 = (sVar46 + 1) * depth + lVar40;
          if (((this->addableViews).m_bits.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar44 >> 6] >> (uVar44 & 0x3f) & 1) != 0) {
            pVVar28 = QueryCompiler::getView
                                ((this->_qc).
                                 super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,*(size_t *)((long)&ppVar17->first + lVar53));
            if ((~(pbVar50->super__Base_bitset<2UL>)._M_w[1] & 0xfffffffff &
                 (pVVar28->_fVars).super__Base_bitset<2UL>._M_w[1] &
                (local_660->_fVars).super__Base_bitset<2UL>._M_w[1]) == 0 &&
                (~(pbVar50->super__Base_bitset<2UL>)._M_w[0] &
                 (pVVar28->_fVars).super__Base_bitset<2UL>._M_w[0] &
                (local_660->_fVars).super__Base_bitset<2UL>._M_w[0]) == 0) {
              __args = (pair<unsigned_long,_unsigned_long> *)
                       ((long)&((aggregate->_incoming).
                                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->first + lVar53);
              if (local_6b8._M_finish == local_6b8._M_end_of_storage) {
                this_01 = &local_6b8;
                __position_00._M_current = local_6b8._M_finish;
                goto LAB_0023f21d;
              }
              uVar35 = __args->second;
              (local_6b8._M_finish)->first = __args->first;
              (local_6b8._M_finish)->second = uVar35;
              pvVar26 = (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         *)&local_6b8._M_start;
LAB_0023f1f3:
              pppVar32 = (pointer *)
                         ((long)&pvVar26->
                                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         + 8);
              *pppVar32 = *pppVar32 + 1;
            }
            else {
              pDVar16 = (this->dependentComputation).
                        super__Vector_base<DependentComputation,_std::allocator<DependentComputation>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar17 = (aggregate->_incoming).
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              __position_00._M_current =
                   *(pointer *)
                    ((long)&pDVar16[lVar41].view.
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl + 8);
              if (__position_00._M_current !=
                  *(pointer *)
                   ((long)&pDVar16[lVar41].view.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl + 0x10)) {
                puVar42 = (unsigned_long *)((long)&ppVar17->first + lVar53);
                pvVar26 = &pDVar16[lVar41].view;
                uVar35 = puVar42[1];
                (__position_00._M_current)->first = *puVar42;
                (__position_00._M_current)->second = uVar35;
                goto LAB_0023f1f3;
              }
              this_01 = (_Vector_impl_data *)&pDVar16[lVar41].view;
              __args = ppVar17 + local_6c8;
LAB_0023f21d:
              std::
              vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>const&>
                        ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                          *)this_01,__position_00,__args);
            }
            sVar46 = QueryCompiler::numberOfViews
                               ((this->_qc).
                                super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               );
            *(size_t *)
             ((long)&((aggregate->_incoming).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->first + lVar53) = sVar46;
          }
          lVar40 = local_6c8 + 1;
          lVar53 = lVar53 + 0x10;
          lVar56 = lVar56 + -1;
          local_6c8 = lVar48;
        } while (lVar56 != 0);
      }
      if (local_270[0] == 0) {
        uVar44 = 0xffffffffffffffff;
        do {
          if (uVar44 == 0x16) goto LAB_0023f294;
          uVar52 = uVar44 + 1;
          lVar48 = uVar44 + 2;
          uVar44 = uVar52;
        } while (local_270[lVar48] == 0);
        if (uVar52 < 0x17) goto LAB_0023f2aa;
LAB_0023f294:
        if (local_6b8._M_start != local_6b8._M_finish) goto LAB_0023f2aa;
        if (local_678 ==
            (long)(pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 3) {
          auVar59._0_4_ =
               -(uint)(((uint)(local_698->_bag).super__Base_bitset<2UL>._M_w[0] & local_628._0_4_)
                      == 0);
          auVar59._4_4_ =
               -(uint)((*(uint *)((long)(local_698->_bag).super__Base_bitset<2UL>._M_w + 4) &
                       local_628._4_4_) == 0);
          auVar59._8_4_ =
               -(uint)(((uint)(local_698->_bag).super__Base_bitset<2UL>._M_w[1] & local_628._8_4_)
                      == 0);
          auVar59._12_4_ =
               -(uint)((*(uint *)((long)(local_698->_bag).super__Base_bitset<2UL>._M_w + 0xc) &
                       local_628._12_4_) == 0);
          auVar62._4_4_ = auVar59._0_4_;
          auVar62._0_4_ = auVar59._4_4_;
          auVar62._8_4_ = auVar59._12_4_;
          auVar62._12_4_ = auVar59._8_4_;
          iVar39 = movmskpd((int)local_698,auVar62 & auVar59);
          if (iVar39 == 3) goto LAB_0023f2aa;
          if (this->viewLevelRegister[view_id] != depth) {
            std::operator<<((ostream *)&std::cerr,
                            "WE HAVE A PRODUCT THAT DOES NOT OCCUR AT THE LOWEST LEVEL!?");
            goto LAB_0023fc96;
          }
LAB_0023f586:
          local_640.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar41] =
               (localAggReg->
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_start[lVar41];
        }
        else if (this->viewLevelRegister[view_id] == depth) goto LAB_0023f586;
      }
      else {
LAB_0023f2aa:
        uStack_4d8 = 0;
        bStack_4d0 = false;
        local_4e8 = 0;
        uStack_4e0 = 0;
        uStack_4df = 0;
        stack0xfffffffffffffb08 = (undefined1  [16])0x0;
        local_508._0_16_ = (undefined1  [16])0x0;
        memcpy(local_5c8,local_270,0xc0);
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     *)local_508,
                    (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     *)&local_6b8);
        uVar44 = (long)(pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        if ((this->viewLevelRegister[view_id] < depth) ||
           (this->viewLevelRegister[view_id] == uVar44)) {
          local_4e8 = 0;
          uStack_4f0 = uVar44;
        }
        else {
          ppVar17 = (localAggReg->
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          local_4e8 = ppVar17[lVar41].second;
          uStack_4f0 = ppVar17[lVar41].first;
        }
        if (local_678 == uVar44) {
          auVar58._0_4_ =
               -(uint)(((uint)(local_698->_bag).super__Base_bitset<2UL>._M_w[0] & local_628._0_4_)
                      == 0);
          auVar58._4_4_ =
               -(uint)((*(uint *)((long)(local_698->_bag).super__Base_bitset<2UL>._M_w + 4) &
                       local_628._4_4_) == 0);
          auVar58._8_4_ =
               -(uint)(((uint)(local_698->_bag).super__Base_bitset<2UL>._M_w[1] & local_628._8_4_)
                      == 0);
          auVar58._12_4_ =
               -(uint)((*(uint *)((long)(local_698->_bag).super__Base_bitset<2UL>._M_w + 0xc) &
                       local_628._12_4_) == 0);
          auVar61._4_4_ = auVar58._0_4_;
          auVar61._0_4_ = auVar58._4_4_;
          auVar61._8_4_ = auVar58._12_4_;
          auVar61._12_4_ = auVar58._8_4_;
          iVar39 = movmskpd((int)local_4e8,auVar61 & auVar58);
          bStack_4d0 = true;
          if (iVar39 != 3) goto LAB_0023f39e;
        }
        else {
LAB_0023f39e:
          bStack_4d0 = false;
        }
        iVar33 = std::
                 _Hashtable<ProductAggregate,_std::pair<const_ProductAggregate,_unsigned_long>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<ProductAggregate>,_ProductAggregate_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->productToVariableMap).
                         super__Vector_base<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[depth]._M_h,(key_type *)local_5c8
                       );
        if (iVar33.super__Node_iterator_base<std::pair<const_ProductAggregate,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          pvVar18 = (this->productToVariableRegister).
                    super__Vector_base<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar49 = *(long *)&pvVar18[depth].
                             super__Vector_base<ProductAggregate,_std::allocator<ProductAggregate>_>
                             ._M_impl.super__Vector_impl_data;
          pPVar19 = *(pointer *)
                     ((long)&pvVar18[depth].
                             super__Vector_base<ProductAggregate,_std::allocator<ProductAggregate>_>
                             ._M_impl.super__Vector_impl_data + 8);
          pmVar34 = std::__detail::
                    _Map_base<ProductAggregate,_std::pair<const_ProductAggregate,_unsigned_long>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<ProductAggregate>,_ProductAggregate_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<ProductAggregate,_std::pair<const_ProductAggregate,_unsigned_long>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<ProductAggregate>,_ProductAggregate_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)((this->productToVariableMap).
                                     super__Vector_base<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + depth),
                                 (key_type *)local_5c8);
          mVar57 = (long)pPVar19 - lVar49 >> 8;
          *pmVar34 = mVar57;
          local_640.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar41].first = depth;
          local_640.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar41].second = mVar57;
          std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>::push_back
                    ((this->productToVariableRegister).
                     super__Vector_base<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + depth,(value_type *)local_5c8);
          sVar46 = local_640.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar41].first;
          uVar35 = local_640.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar41].second;
          lVar49 = local_688;
        }
        else {
          uVar35 = *(unsigned_long *)
                    ((long)iVar33.
                           super__Node_iterator_base<std::pair<const_ProductAggregate,_unsigned_long>,_true>
                           ._M_cur + 0x108);
          local_640.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar41].first = depth;
          local_640.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar41].second = uVar35;
          sVar46 = depth;
        }
        ppVar17 = (localAggReg->
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        ppVar17[lVar41].first = sVar46;
        ppVar17[lVar41].second = uVar35;
        if ((pointer)local_508._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_508._0_8_);
        }
      }
      lVar41 = lVar41 + 1;
      local_668 = local_668 + 0xd8;
      lVar49 = lVar49 + 0xc0;
      local_690 = local_690 + local_610;
    } while (lVar41 != local_608);
    uVar35 = (long)(pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    if (uVar35 - 1 == depth) {
      if (pbVar7 != pbVar6) {
        lVar49 = __n + (__n == 0);
        puVar42 = &((localAggReg->
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    )._M_impl.super__Vector_impl_data._M_start)->second;
        do {
          ((pair<unsigned_long,_unsigned_long> *)(puVar42 + -1))->first = uVar35;
          *puVar42 = 0;
          puVar42 = puVar42 + 2;
          lVar49 = lVar49 + -1;
        } while (lVar49 != 0);
      }
    }
    else {
LAB_0023f632:
      registerAggregatesToVariables
                (this,aggregate,local_618,view_id,local_680,depth + 1,localAggReg);
    }
  }
  uVar44 = this->viewLevelRegister[view_id];
  if (uVar44 < depth) {
    if (pbVar7 == pbVar6) goto LAB_0023fb98;
LAB_0023f6b8:
    lVar41 = 0;
    lVar49 = 0;
    do {
      uVar44 = (long)(pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      ppVar17 = (localAggReg->
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((*(ulong *)((long)&(local_640.
                              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->first + lVar41) < uVar44)
         || (*(ulong *)((long)&ppVar17->first + lVar41) < uVar44)) {
        local_5c8._0_16_ =
             *(undefined1 (*) [16])
              ((long)&(local_640.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->first + lVar41);
        local_5c8._16_16_ = *(undefined1 (*) [16])((long)&ppVar17->first + lVar41);
        iVar36 = std::
                 _Hashtable<PostAggRegTuple,_std::pair<const_PostAggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<PostAggRegTuple>,_PostAggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->postRegisterMap).
                         super__Vector_base<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[depth]._M_h,(key_type *)local_5c8
                       );
        if (iVar36.super__Node_iterator_base<std::pair<const_PostAggRegTuple,_unsigned_long>,_true>.
            _M_cur == (__node_type *)0x0) {
          pvVar21 = (this->postRegisterList).
                    super__Vector_base<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar48 = *(long *)&pvVar21[depth].
                             super__Vector_base<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>.
                             _M_impl.super__Vector_impl_data;
          pPVar22 = *(pointer *)
                     ((long)&pvVar21[depth].
                             super__Vector_base<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>.
                             _M_impl.super__Vector_impl_data + 8);
          pmVar37 = std::__detail::
                    _Map_base<PostAggRegTuple,_std::pair<const_PostAggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<PostAggRegTuple>,_PostAggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<PostAggRegTuple,_std::pair<const_PostAggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<PostAggRegTuple>,_PostAggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)((this->postRegisterMap).
                                     super__Vector_base<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + depth),
                                 (key_type *)local_5c8);
          mVar54 = (long)pPVar22 - lVar48 >> 5;
          *pmVar37 = mVar54;
          ppVar17 = (localAggReg->
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          *(size_t *)((long)&ppVar17->first + lVar41) = depth;
          *(mapped_type *)((long)&ppVar17->second + lVar41) = mVar54;
          this_00 = (vector<PostAggRegTuple,std::allocator<PostAggRegTuple>> *)
                    ((this->postRegisterList).
                     super__Vector_base<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + depth);
          __position._M_current = *(PostAggRegTuple **)(this_00 + 8);
          if (__position._M_current == *(PostAggRegTuple **)(this_00 + 0x10)) {
            std::vector<PostAggRegTuple,std::allocator<PostAggRegTuple>>::
            _M_realloc_insert<PostAggRegTuple_const&>
                      (this_00,__position,(PostAggRegTuple *)local_5c8);
          }
          else {
            ((__position._M_current)->post).first = local_5c8._16_8_;
            ((__position._M_current)->post).second = local_5c8._24_8_;
            ((__position._M_current)->local).first = local_5c8._0_8_;
            ((__position._M_current)->local).second = local_5c8._8_8_;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x20;
          }
        }
        else {
          uVar20 = *(undefined8 *)
                    ((long)iVar36.
                           super__Node_iterator_base<std::pair<const_PostAggRegTuple,_unsigned_long>,_true>
                           ._M_cur + 0x28);
          ppVar17 = (localAggReg->
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          *(size_t *)((long)&ppVar17->first + lVar41) = depth;
          *(undefined8 *)((long)&ppVar17->second + lVar41) = uVar20;
        }
      }
      else if (depth + 1 != uVar44) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"ERROR ERROR ERROR - postAggregate is empty ",0x2b);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"we would expect it to contain something || ",0x2b);
        poVar38 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar38," : ",3);
        poVar38 = std::ostream::_M_insert<unsigned_long>((ulong)poVar38);
        std::__ostream_insert<char,std::char_traits<char>>(poVar38,"  ",2);
        poVar38 = std::ostream::_M_insert<unsigned_long>((ulong)poVar38);
        std::operator<<(poVar38,"\n");
LAB_0023fc96:
        exit(1);
      }
      lVar49 = lVar49 + 1;
      lVar41 = lVar41 + 0x10;
    } while (__n + (__n == 0) != lVar49);
    uVar44 = this->viewLevelRegister[view_id];
  }
  else if (uVar44 == (long)(pvVar5->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar5->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3 && pbVar7 != pbVar6)
  goto LAB_0023f6b8;
  if (uVar44 == depth) {
    if (pbVar7 == pbVar6) goto LAB_0023fb98;
  }
  else if ((depth != 0) ||
          (uVar44 != (long)(pvVar5->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar5->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3 || pbVar7 == pbVar6))
  goto LAB_0023fb98;
  lVar49 = 8;
  local_6a0 = local_6a0 << 3;
  lVar41 = 0;
  do {
    pDVar23 = (this->dependentComputation).
              super__Vector_base<DependentComputation,_std::allocator<DependentComputation>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pDVar16 = pDVar23 + lVar41;
    memset(local_370,0,0xf9);
    memcpy(local_370,pDVar16,0xc0);
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::operator=(&local_2b0,&pDVar23[lVar41].view);
    sVar46 = (long)(pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    uStack_290 = 0;
    local_5c8._56_8_ = 0;
    local_5c8[0x40] = false;
    local_5c8._72_8_ = 0;
    local_298 = sVar46;
    memset(local_490,0,0xf9);
    local_5c8._16_8_ = 0;
    local_5c8._24_8_ = 0;
    local_5c8._32_8_ = 0;
    local_5c8._40_8_ = 0;
    local_5c8[0x30] = false;
    memset(local_5c8 + 0x58,0,0xd9);
    local_5c8._8_8_ = local_680;
    local_5c8._0_8_ = view_id;
    if (this->viewLevelRegister[view_id] == sVar46) {
      local_5c8._24_8_ = 0;
      local_5c8._16_8_ = sVar46;
    }
    else {
      local_5c8._16_8_ =
           local_640.
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar41].first;
      local_5c8._24_8_ =
           local_640.
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar41].second;
    }
    local_5c8._32_16_ =
         *(undefined1 (*) [16])
          ((localAggReg->
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_start + lVar41);
    pDVar24 = (this->dependentComputation).
              super__Vector_base<DependentComputation,_std::allocator<DependentComputation>_>.
              _M_impl.super__Vector_impl_data._M_start;
    memcpy(local_5c8 + 0x58,pDVar24 + lVar41,0xc0);
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::operator=(&local_4b0,&pDVar24[lVar41].view);
    memcpy(local_490,local_370,0xc0);
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::operator=(&local_3d0,&local_2b0);
    local_3b8 = local_298;
    uStack_3b0 = uStack_290;
    local_3a8 = local_288;
    uStack_3a0 = uStack_280;
    local_398 = (bool)local_278;
    if ((pDVar16->product).super__Base_bitset<24UL>._M_w[0] == 0) {
      uVar44 = 0xffffffffffffffff;
      do {
        if (uVar44 == 0x16) goto LAB_0023fb14;
        uVar52 = uVar44 + 1;
        lVar48 = uVar44 * 8;
        uVar44 = uVar52;
      } while (*(long *)((long)(pDVar23->product).super__Base_bitset<24UL>._M_w +
                        lVar48 + lVar49 + 8) == 0);
      if (uVar52 < 0x17) goto LAB_0023fb24;
LAB_0023fb14:
      if ((pDVar16->view).
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          *(pointer *)
           ((long)&(pDVar16->view).
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl + 8)) goto LAB_0023fb24;
    }
    else {
LAB_0023fb24:
      local_498 = true;
    }
    std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>::push_back
              ((vector<AggregateTuple,_std::allocator<AggregateTuple>_> *)
               ((long)&(((this->aggregateComputation).
                         super__Vector_base<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>)._M_impl.
                       super__Vector_impl_data + local_6a0),(value_type *)local_5c8);
    if (local_3d0.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3d0.
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_4b0.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4b0.
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_2b0.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b0.
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    lVar41 = lVar41 + 1;
    lVar49 = lVar49 + 0xd8;
  } while (lVar41 != __n + (__n == 0));
LAB_0023fb98:
  if (local_6b8._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_6b8._M_start);
  }
  if (local_640.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_640.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_390.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_390.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CppGenerator::registerAggregatesToVariables(
    Aggregate* aggregate, const size_t group_id,
    const size_t view_id, const size_t agg_id, const size_t depth,
    std::vector<std::pair<size_t, size_t>>& localAggReg)
{
    std::vector<std::pair<size_t,size_t>>& incoming = aggregate->_incoming;

    View* view = _qc->getView(view_id);
    TDNode* node = _td->getRelation(view->_origin);
    const var_bitset& relationBag = node->_bag;
    
    const std::vector<size_t>& varOrder = groupVariableOrder[group_id];
    const var_bitset& varOrderBitset = groupVariableOrderBitset[group_id];
    
    const size_t numLocalProducts = aggregate->_agg.size();
    const size_t numberIncomingViews =
        (view->_origin == view->_destination ? node->_numOfNeighbors :
         node->_numOfNeighbors - 1);
    
    dyn_bitset loopFactors(_qc->numberOfViews()+1);

    std::vector<std::pair<size_t, size_t>>
        localComputation(numLocalProducts, {varOrder.size(), 0});

    std::vector<std::pair<size_t,size_t>> viewReg;
    prod_bitset localFunctions, considered;

    // TODO: we computed this before - perhaps reuse?! 
    // Compute dependent variables on the variables in the head of view:
    var_bitset dependentVariables;
    var_bitset nonVarOrder = view->_fVars & ~varOrderBitset;

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (nonVarOrder[var])
        {
            // find bag that contains this variable
            if (relationBag[var])
                dependentVariables |= relationBag & ~varOrderBitset;
            else
            {
                // check incoming views
                for (const size_t& incViewID : incomingViews[view_id])
                {
                    View* incView = _qc->getView(incViewID);
                    if (incView->_fVars[var])
                        dependentVariables |= incView->_fVars & ~varOrderBitset;
                }
            }
        }
    }
    
    // go over each product and check if parts of it can be computed at current depth
    size_t incCounter = 0;
    for (size_t prodID = 0; prodID < numLocalProducts; ++prodID)
    {
        prod_bitset &product = aggregate->_agg[prodID];

        considered.reset();
        localFunctions.reset();
        
        for (size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
        {
            if (product.test(f) && !considered[f])
            {
                Function* function = _qc->getFunction(f);
                considered.set(f);
                
                // check if this function is covered
                if ((function->_fVars & coveredVariables[depth]) == function->_fVars)
                {   
                    // get all variables that this function depends on. 
                    var_bitset dependentFunctionVars;
                    for (size_t var=0; var<NUM_OF_VARIABLES;++var)
                    {
                        if (function->_fVars[var])
                            dependentFunctionVars |= variableDependency[var];
                    }
                    dependentFunctionVars &= ~varOrderBitset;

                    // Find all functions that overlap / depend on this function
                    bool overlaps, computeHere;
                    var_bitset overlapVars;
                    prod_bitset overlapFunc = prod_bitset().set(f);

                    do
                    {
                        overlaps = false;
                        computeHere = true;
                        overlapVars |= function->_fVars;

                        for (size_t f2 = 0; f2 < NUM_OF_FUNCTIONS; ++f2)
                        {
                            if (product[f2] && !considered[f2] && !overlapFunc[f2])
                            {
                                Function* otherFunction = _qc->getFunction(f);
                                const var_bitset& otherFVars = otherFunction->_fVars;
                                // check if functions depend on each other
                                // if ((otherFunction->_fVars & nonVarOrder).any()) 
                                if ((otherFVars & dependentFunctionVars).any())
                                {
                                    considered.set(f2);
                                    overlapFunc.set(f2);
                                    overlaps = true;
                                    overlapVars |= otherFunction->_fVars;
                                    // check if otherFunction is covered
                                    if ((otherFVars & coveredVariables[depth]) !=
                                        otherFVars)
                                    {
                                        // if it is not covered then compute entire
                                        // group at later stage
                                        computeHere = false;
                                    }
                                }
                            }
                        }
                    } while(overlaps && !computeHere);
                                    
                    if (computeHere)
                    {
                        // check if the variables are dependent on vars in head
                        // of outcoming view
                        if (((overlapVars & ~varOrderBitset) & dependentVariables).any())
                        {
                            if (viewLevelRegister[view_id] != depth)
                                ERROR("ERROR ERROR: in dependent computation:"
                                      <<" viewLevelRegister[viewID] != depth\n");
                            
                            dependentComputation[prodID].product |= overlapFunc;
                        }
                        else // add all functions that overlap together at this level!
                            localFunctions |= overlapFunc;

                        // remove overlapping functions from product
                        product &= ~overlapFunc;
                    }
                }
            }
        }
        
        // go over each incoming views and check if their incoming products can
        // be computed at this level. 
        viewReg.clear();

        for (size_t n = 0; n < numberIncomingViews; ++n)
        {
            size_t& incViewID = incoming[incCounter].first;

            if (addableViews[incViewID + (depth * (_qc->numberOfViews()+1))])
            {
                View* incView = _qc->getView(incViewID);

                // TODO: I think the below statement is fine but should we use
                // dependent variables instead?! - here we just check if any of
                // the vars from incView are present in the vars for view
                if (((incView->_fVars & ~varOrderBitset) & view->_fVars).none())
                {
                    viewReg.push_back(incoming[incCounter]);

                    /************** PRINT OUT ****************/
                    // if (group_id == 5 &&  incoming[incCounter].first == 2 &&
                    //     incoming[incCounter].second == 125)
                    // {
                    //     std::cout << "##--------" <<
                    //         incoming[incCounter].first << " - " <<
                    //         incoming[incCounter].second << std::endl;
                    // }
                    /************** PRINT OUT ****************/
                }
                else
                {
                    // if (depth == viewLevelRegister[view_id])
                    // {
                    // std::cout << "This view has an additional variable: "+
                    //     viewName[incViewID]+"\nviewAgg: aggs_"+viewName[incViewID]
                    //     +"-"+" viewLevelReg: "<<viewLevelRegister[view_id]<<
                    //     " depth: " << depth << std::endl;
                    dependentComputation[prodID].view.push_back(
                        incoming[incCounter]);
                    // }
                    // if (depth != viewLevelRegister[view_id])
                    // {
                    //     ERROR(depth << "  " << incViewID << "  " << view_id << " "
                    //           << viewLevelRegister[view_id] << " "+node->_name+" ");
                    //     ERROR(view->_fVars << std::endl);
                    //     ERROR("IS THIS A MISTAKE?!\n");
                    // }       
                }

                // This incoming view will no longer be considered 
                incoming[incCounter].first = _qc->numberOfViews();
            }
            ++incCounter;
        }
        
        // Check if this product has already been computed, if not we add it
        // to the list
        if (localFunctions.any() || !viewReg.empty() ||
            (depth+1 == varOrder.size() &&
                (dependentVariables & relationBag & nonVarOrder).none()))
        {                
            ProductAggregate prodAgg;
            prodAgg.product = localFunctions;
            prodAgg.viewAggregate = viewReg;
            
            if (depth <= viewLevelRegister[view_id] &&
                viewLevelRegister[view_id] != varOrder.size())
            {
                prodAgg.previous = localAggReg[prodID];
            }
            else
                prodAgg.previous = {varOrder.size(), 0};

            if (depth+1 == varOrder.size() &&
                (dependentVariables & relationBag & nonVarOrder).none())
                prodAgg.multiplyByCount = true;
            else
                prodAgg.multiplyByCount = false;
            
            auto prod_it = productToVariableMap[depth].find(prodAgg);
            if (prod_it != productToVariableMap[depth].end())
            {
                // Then update the localAggReg for this product
                localComputation[prodID] = {depth,prod_it->second};                
            }
            else
            {
                size_t newProdID =  productToVariableRegister[depth].size();
                // If so, add it to the aggregate register
                productToVariableMap[depth][prodAgg] = newProdID;
                localComputation[prodID] = {depth,newProdID};
                productToVariableRegister[depth].push_back(prodAgg);                
            }
            
            localAggReg[prodID] = localComputation[prodID];

            /******** PRINT OUT **********/
            // dyn_bitset contribViews(_qc->numberOfViews()+1);
            // for (auto& p : viewReg)
            //     contribViews.set(p.first);
            
            // std::cout << "group_id " << group_id << " depth: " << depth << std::endl;
            // std::cout << genProductString(*node, contribViews, localFunctions)
            //           << std::endl;
            /******** PRINT OUT **********/
        }    
        // if we didn't set a new computation - check if this level is the view Level:
        else if (depth == viewLevelRegister[view_id])
        {
            // Add the previous aggregate to local computation
            localComputation[prodID] = localAggReg[prodID];
            // TODO: (CONSIDER) think about keeping this separate as above
        }
        else if (depth+1 == varOrder.size())
        {
            ERROR("WE HAVE A PRODUCT THAT DOES NOT OCCUR AT THE LOWEST LEVEL!?");
            exit(1);
        }
    }
    
    // recurse to next depth ! 
    if (depth != varOrder.size()-1)
    {
        registerAggregatesToVariables(
            aggregate,group_id,view_id,agg_id,depth+1,localAggReg);
    }
    else
    {
        // resetting aggRegisters !        
        for (size_t i = 0; i < numLocalProducts; ++i)
            localAggReg[i] = {varOrder.size(),0};
    }
    
    if (depth > viewLevelRegister[view_id] ||
        viewLevelRegister[view_id] == varOrder.size())
    {
        // now adding aggregates coming from below to running sum
        for (size_t prodID = 0; prodID < numLocalProducts; ++prodID)
        {
            if (localComputation[prodID].first < varOrder.size() ||
                localAggReg[prodID].first < varOrder.size())
            {
                PostAggRegTuple postTuple;                
                postTuple.local = localComputation[prodID];
                postTuple.post = localAggReg[prodID];

                auto postit = postRegisterMap[depth].find(postTuple);
                if (postit != postRegisterMap[depth].end())
                {
                    localAggReg[prodID] = {depth,postit->second};
                }
                else
                {
                    size_t postProdID = postRegisterList[depth].size();
                    postRegisterMap[depth][postTuple] = postProdID;
                    localAggReg[prodID] = {depth, postProdID};
                    postRegisterList[depth].push_back(postTuple);
                }
            }
            else if (depth+1 != varOrder.size())
            {
                ERROR("ERROR ERROR ERROR - postAggregate is empty ");
                ERROR("we would expect it to contain something || ");
                ERROR(depth << " : " << varOrder.size()<< "  " << prodID << "\n");
                exit(1);
            }
        }
    }
    
    if (depth == viewLevelRegister[view_id] || 
        (depth == 0 && viewLevelRegister[view_id] == varOrder.size()))
    {
        // We now add both components to the respecitve registers
        // std::pair<bool,size_t> regTupleProduct;
        // std::pair<bool,size_t> regTupleView;

        // now adding aggregates to final computation 
        for (size_t prodID = 0; prodID < numLocalProducts; ++prodID)
        {
            // TODO: Why not avoid this loop and put the vectors into the
            // AggregateTuple
            // This is then one aggregateTuple for one specific Aggregate for
            // this view
            // THen add this aggregate to the specific view and not to depth
            
            const prod_bitset&  dependentFunctions =
                dependentComputation[prodID].product;
            const std::vector<std::pair<size_t,size_t>>& dependentViewReg =
                dependentComputation[prodID].view;

            ProductAggregate prodAgg;
            prodAgg.product = dependentFunctions;
            prodAgg.viewAggregate = dependentViewReg;
            prodAgg.previous = {varOrder.size(), 0};
            
            AggregateTuple aggComputation;
            aggComputation.viewID = view_id;
            aggComputation.aggID = agg_id;
            if (viewLevelRegister[view_id] != varOrder.size()) 
                aggComputation.local = localComputation[prodID];
            else
                 aggComputation.local = {varOrder.size(), 0};
            aggComputation.post = localAggReg[prodID];
            aggComputation.dependentComputation = dependentComputation[prodID];
            aggComputation.dependentProdAgg = prodAgg;

            if (dependentFunctions.any() || !dependentViewReg.empty())
                aggComputation.hasDependentComputation = true;
            
            // if (dependentFunctions.any() || !dependentViewReg.empty())
            // {                
            //     ProductAggregate prodAgg;
            //     prodAgg.product = dependentFunctions;
            //     prodAgg.viewAggregate = dependentViewReg;
            //     prodAgg.previous = {varOrder.size(), 0};
            //     auto prod_it = productToVariableMap[depDepth].find(prodAgg);
            //     if (prod_it != productToVariableMap[depDepth].end())
            //     {
            //         // Then update the localAggReg for this product
            //         aggComputation.dependentProduct = {depDepth,prod_it->second};
            //     }
            //     else
            //     {
            //         // If so, add it to the aggregate register
            //         size_t newProdID = productToVariableRegister[depDepth].size();
            //         productToVariableMap[depDepth][prodAgg] = newProdID;
            //         aggComputation.dependentProduct = {depDepth,newProdID};
            //         productToVariableRegister[depDepth].push_back(prodAgg);
            //     }
            // }
            // else
            // {
            //     aggComputation.dependentProduct = {varOrder.size(), 0};
            // }
            
            aggregateComputation[view_id].push_back(aggComputation);
        }
    }
}